

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::ExportAssimp2Json(char *file,IOSystem *io,aiScene *scene,ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  type out;
  undefined1 local_220 [8];
  JSONWriter s;
  MeshSplitter splitter;
  aiScene *local_38;
  aiScene *scenecopy_tmp;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> str;
  ExportProperties *param_3_local;
  aiScene *scene_local;
  IOSystem *io_local;
  char *file_local;
  
  str._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)param_4
  ;
  iVar1 = (*io->_vptr_IOSystem[4])(io,file,"wt");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&scenecopy_tmp,
             (pointer)CONCAT44(extraout_var,iVar1));
  std::unique_ptr::operator_cast_to_bool((unique_ptr *)&scenecopy_tmp);
  aiCopyScene(scene,&local_38);
  MeshSplitter::SetLimit((MeshSplitter *)&s.first,0x10000);
  MeshSplitter::Execute((MeshSplitter *)&s.first,local_38);
  out = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator*
                  ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)
                   &scenecopy_tmp);
  JSONWriter::JSONWriter((JSONWriter *)local_220,out,2);
  Write((JSONWriter *)local_220,local_38);
  JSONWriter::~JSONWriter((JSONWriter *)local_220);
  aiFreeScene(local_38);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
            ((unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> *)&scenecopy_tmp)
  ;
  return;
}

Assistant:

void ExportAssimp2Json(const char* file, Assimp::IOSystem* io, const aiScene* scene, const Assimp::ExportProperties*) {
    std::unique_ptr<Assimp::IOStream> str(io->Open(file, "wt"));
    if (!str) {
        //throw Assimp::DeadlyExportError("could not open output file");
    }

    // get a copy of the scene so we can modify it
    aiScene* scenecopy_tmp;
    aiCopyScene(scene, &scenecopy_tmp);

    try {
        // split meshes so they fit into a 16 bit index buffer
        MeshSplitter splitter;
        splitter.SetLimit(1 << 16);
        splitter.Execute(scenecopy_tmp);

        // XXX Flag_WriteSpecialFloats is turned on by default, right now we don't have a configuration interface for exporters
        JSONWriter s(*str, JSONWriter::Flag_WriteSpecialFloats);
        Write(s, *scenecopy_tmp);

    }
    catch (...) {
        aiFreeScene(scenecopy_tmp);
        throw;
    }
    aiFreeScene(scenecopy_tmp);
}